

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void convertRGBA64PMToRGBA32F(QRgbaFloat32 *buffer,quint64 *src,int count)

{
  float *pfVar1;
  ulong uVar2;
  long lVar3;
  float fVar4;
  
  if (0 < count) {
    lVar3 = 0;
    do {
      uVar2 = *(ulong *)((long)src + lVar3);
      fVar4 = (float)(ushort)(uVar2 >> 0x30) * 1.5259022e-05;
      pfVar1 = (float *)((long)&buffer->r + lVar3 * 2);
      *pfVar1 = fVar4 * (float)((uint)uVar2 & 0xffff) * 1.5259022e-05;
      pfVar1[1] = fVar4 * (float)(int)(uVar2 >> 0x10 & 0xffff) * 1.5259022e-05;
      pfVar1[2] = (float)((uint)(uVar2 >> 0x20) & 0xffff) * 1.5259022e-05 * fVar4;
      pfVar1[3] = fVar4;
      lVar3 = lVar3 + 8;
    } while ((ulong)(uint)count << 3 != lVar3);
  }
  return;
}

Assistant:

static void QT_FASTCALL convertRGBA64PMToRGBA32F(QRgbaFloat32 *buffer, const quint64 *src, int count)
{
    const auto *in = reinterpret_cast<const QRgba64 *>(src);
    for (int i = 0; i < count; ++i) {
        auto c = in[i];
        buffer[i] = QRgbaFloat32::fromRgba64(c.red(), c.green(), c.blue(), c.alpha()).premultiplied();
    }
}